

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O0

bool __thiscall NurseSolution::addTurn(NurseSolution *this,Turn *turn)

{
  bool bVar1;
  Turn *local_20;
  Turn *turn_local;
  NurseSolution *this_local;
  
  local_20 = turn;
  turn_local = (Turn *)this;
  bVar1 = hasTurn(this,turn);
  if (!bVar1) {
    std::vector<Turn_*,_std::allocator<Turn_*>_>::push_back(&this->turns,&local_20);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool NurseSolution::addTurn(Turn* turn){
    if(!hasTurn(turn))
    {
        turns.push_back(turn);
        return true;
    }
    return false;
}